

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O1

sat_solver * Pdr_ManNewSolver(sat_solver *pSat,Pdr_Man_t *p,int k,int fInit)

{
  Aig_Obj_t *pObj;
  int *piVar1;
  uint uVar2;
  Cnf_Dat_t *pCVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Aig_Man_t *pAVar10;
  int iVar11;
  int iVar12;
  
  if (pSat == (sat_solver *)0x0) {
    __assert_fail("pSat != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                  ,0x1b5,"sat_solver *Pdr_ManNewSolver(sat_solver *, Pdr_Man_t *, int, int)");
  }
  if (p->pPars->fMonoCnf != 0) {
    if (p->pCnf1 == (Cnf_Dat_t *)0x0) {
      pAVar10 = p->pAig;
      iVar11 = pAVar10->nRegs;
      iVar8 = pAVar10->nObjs[3];
      pAVar10->nRegs = iVar8;
      pCVar3 = Cnf_DeriveWithMan(p->pCnfMan,pAVar10,iVar8);
      p->pCnf1 = pCVar3;
      pAVar10 = p->pAig;
      pAVar10->nRegs = iVar11;
      if (p->vVar2Reg != (Vec_Int_t *)0x0) {
        __assert_fail("p->vVar2Reg == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                      ,0x16e,"sat_solver *Pdr_ManNewSolver1(sat_solver *, Pdr_Man_t *, int, int)");
      }
      iVar11 = pCVar3->nVars;
      pVVar4 = (Vec_Int_t *)malloc(0x10);
      iVar8 = 0x10;
      if (0xe < iVar11 - 1U) {
        iVar8 = iVar11;
      }
      pVVar4->nSize = 0;
      pVVar4->nCap = iVar8;
      if (iVar8 == 0) {
        piVar5 = (int *)0x0;
      }
      else {
        piVar5 = (int *)malloc((long)iVar8 << 2);
      }
      pVVar4->pArray = piVar5;
      pVVar4->nSize = iVar11;
      memset(piVar5,0xff,(long)iVar11 << 2);
      p->vVar2Reg = pVVar4;
      if (0 < pAVar10->nRegs) {
        iVar11 = 0;
        do {
          uVar2 = pAVar10->nTruePos + iVar11;
          if (((int)uVar2 < 0) || (pAVar10->vCos->nSize <= (int)uVar2)) goto LAB_00549c74;
          pObj = (Aig_Obj_t *)pAVar10->vCos->pArray[uVar2];
          pVVar4 = p->vVar2Reg;
          if (p->pPars->fMonoCnf == 0) {
            uVar2 = Pdr_ObjSatVar2(p,k,pObj,0,3);
          }
          else {
            uVar2 = p->pCnf1->pVarNums[pObj->Id];
          }
          if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar4->pArray[uVar2] = iVar11;
          iVar11 = iVar11 + 1;
          pAVar10 = p->pAig;
        } while (iVar11 < pAVar10->nRegs);
      }
    }
    pSat = (sat_solver *)Cnf_DataWriteIntoSolverInt(pSat,p->pCnf1,1,fInit);
    goto LAB_00549c54;
  }
  if (p->pCnf2 == (Cnf_Dat_t *)0x0) {
    pCVar3 = Cnf_DeriveOtherWithMan(p->pCnfMan,p->pAig,0);
    p->pCnf2 = pCVar3;
    pVVar4 = (Vec_Int_t *)calloc((long)p->pAig->vObjs->nSize,0x10);
    p->pvId2Vars = pVVar4;
    if ((p->vVar2Ids).nCap < 0x100) {
      ppvVar6 = (p->vVar2Ids).pArray;
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x800);
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,0x800);
      }
      (p->vVar2Ids).pArray = ppvVar6;
      (p->vVar2Ids).nCap = 0x100;
    }
  }
  if ((p->vVar2Ids).nSize <= k) {
    iVar11 = k + 1;
    iVar8 = (p->vVar2Ids).nCap;
    iVar12 = iVar8 * 2;
    if (k < iVar12) {
      if (iVar8 < iVar12 && iVar8 <= k) {
        ppvVar6 = (p->vVar2Ids).pArray;
        if (ppvVar6 == (void **)0x0) {
          ppvVar6 = (void **)malloc((long)iVar8 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(ppvVar6,(long)iVar8 << 4);
        }
        (p->vVar2Ids).pArray = ppvVar6;
LAB_00549b6b:
        (p->vVar2Ids).nCap = iVar12;
      }
    }
    else if (iVar8 <= k) {
      ppvVar6 = (p->vVar2Ids).pArray;
      if (ppvVar6 == (void **)0x0) {
        ppvVar6 = (void **)malloc((long)iVar11 << 3);
      }
      else {
        ppvVar6 = (void **)realloc(ppvVar6,(long)iVar11 << 3);
      }
      (p->vVar2Ids).pArray = ppvVar6;
      iVar12 = iVar11;
      goto LAB_00549b6b;
    }
    iVar8 = (p->vVar2Ids).nSize;
    lVar7 = (long)iVar8;
    if (iVar8 <= k) {
      do {
        (p->vVar2Ids).pArray[lVar7] = (void *)0x0;
        lVar7 = lVar7 + 1;
      } while (iVar11 != lVar7);
    }
    (p->vVar2Ids).nSize = iVar11;
  }
  if ((k < 0) || ((p->vVar2Ids).nSize <= k)) {
LAB_00549c74:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar6 = (p->vVar2Ids).pArray;
  pVVar4 = (Vec_Int_t *)ppvVar6[(uint)k];
  if (pVVar4 == (Vec_Int_t *)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 500;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(2000);
    pVVar4->pArray = piVar5;
    ppvVar6[(uint)k] = pVVar4;
  }
  if (0 < pVVar4->nSize) {
    piVar5 = pVVar4->pArray;
    lVar7 = 0;
    do {
      lVar9 = (long)piVar5[lVar7];
      if (lVar9 != -1) {
        if (p->pvId2Vars[lVar9].nSize <= k) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar1 = p->pvId2Vars[lVar9].pArray;
        if (piVar1[(uint)k] < 1) {
          __assert_fail("Vec_IntEntry( p->pvId2Vars + Entry, k ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrCnf.c"
                        ,0x19c,"sat_solver *Pdr_ManNewSolver2(sat_solver *, Pdr_Man_t *, int, int)")
          ;
        }
        piVar1[(uint)k] = 0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar4->nSize);
  }
  pVVar4->nSize = 0;
  Vec_IntPush(pVVar4,-1);
  sat_solver_setnvars(pSat,500);
LAB_00549c54:
  pSat->nRuntimeLimit = p->timeToStop;
  return pSat;
}

Assistant:

sat_solver * Pdr_ManNewSolver( sat_solver * pSat, Pdr_Man_t * p, int k, int fInit )
{
    assert( pSat != NULL );
    if ( p->pPars->fMonoCnf )
        return Pdr_ManNewSolver1( pSat, p, k, fInit );
    else
        return Pdr_ManNewSolver2( pSat, p, k, fInit );
}